

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

void __thiscall
prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *this,size_type new_capacity)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->_size;
  if (new_capacity < 0x1d) {
    if (0x1c < uVar1) {
      pcVar3 = (this->_union).indirect_contents.indirect;
      memcpy(this,pcVar3,(ulong)(uVar1 - 0x1d));
      free(pcVar3);
      this->_size = this->_size - 0x1d;
    }
  }
  else if (uVar1 < 0x1d) {
    pcVar3 = (char *)malloc((ulong)new_capacity);
    if (pcVar3 == (char *)0x0) {
      __assert_fail("new_indirect",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/prevector.h"
                    ,0xc3,
                    "void prevector<28, unsigned char>::change_capacity(size_type) [N = 28, T = unsigned char, Size = unsigned int, Diff = int]"
                   );
    }
    __memcpy_chk(pcVar3,this,uVar1,(ulong)new_capacity);
    (this->_union).indirect_contents.indirect = pcVar3;
    (this->_union).indirect_contents.capacity = new_capacity;
    this->_size = uVar1 + 0x1d;
  }
  else {
    pcVar3 = (char *)realloc((this->_union).indirect_contents.indirect,(ulong)new_capacity);
    (this->_union).indirect_contents.indirect = pcVar3;
    if (pcVar3 == (char *)0x0) {
      __assert_fail("_union.indirect_contents.indirect",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/prevector.h"
                    ,0xbf,
                    "void prevector<28, unsigned char>::change_capacity(size_type) [N = 28, T = unsigned char, Size = unsigned int, Diff = int]"
                   );
    }
    (this->_union).indirect_contents.capacity = new_capacity;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void change_capacity(size_type new_capacity) {
        if (new_capacity <= N) {
            if (!is_direct()) {
                T* indirect = indirect_ptr(0);
                T* src = indirect;
                T* dst = direct_ptr(0);
                memcpy(dst, src, size() * sizeof(T));
                free(indirect);
                _size -= N + 1;
            }
        } else {
            if (!is_direct()) {
                /* FIXME: Because malloc/realloc here won't call new_handler if allocation fails, assert
                    success. These should instead use an allocator or new/delete so that handlers
                    are called as necessary, but performance would be slightly degraded by doing so. */
                _union.indirect_contents.indirect = static_cast<char*>(realloc(_union.indirect_contents.indirect, ((size_t)sizeof(T)) * new_capacity));
                assert(_union.indirect_contents.indirect);
                _union.indirect_contents.capacity = new_capacity;
            } else {
                char* new_indirect = static_cast<char*>(malloc(((size_t)sizeof(T)) * new_capacity));
                assert(new_indirect);
                T* src = direct_ptr(0);
                T* dst = reinterpret_cast<T*>(new_indirect);
                memcpy(dst, src, size() * sizeof(T));
                _union.indirect_contents.indirect = new_indirect;
                _union.indirect_contents.capacity = new_capacity;
                _size += N + 1;
            }
        }
    }